

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking_hugeint.cpp
# Opt level: O3

void duckdb::HugeIntPacker::Pack(uhugeint_t *in,uint32_t *out,bitpacking_width_t width)

{
  uint64_t *puVar1;
  byte bVar2;
  uint64_t value;
  uint *puVar3;
  uint32_t uVar4;
  long lVar5;
  undefined7 in_register_00000011;
  int iVar6;
  uint uVar7;
  uint8_t i_1;
  uint uVar8;
  uhugeint_t *puVar10;
  uint8_t i;
  ulong uVar11;
  uhugeint_t local_f8;
  uhugeint_t local_e8;
  uhugeint_t local_d8;
  uint64_t local_c8;
  long local_c0;
  uhugeint_t local_b8;
  uint *local_a8;
  uhugeint_t local_a0;
  undefined8 local_90;
  uhugeint_t local_88;
  uint64_t local_78;
  uint64_t uStack_70;
  uhugeint_t local_60;
  uhugeint_t local_50;
  uhugeint_t local_40;
  uint uVar9;
  
  local_90 = CONCAT71(in_register_00000011,width);
  switch((uint)local_90 << 0x1b | (uint)local_90 >> 5) {
  case 0:
    break;
  case 1:
    lVar5 = 0;
    do {
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(in);
      out[lVar5] = uVar4;
      lVar5 = lVar5 + 1;
      in = in + 1;
    } while (lVar5 != 0x20);
    break;
  case 2:
    lVar5 = 0;
    do {
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(in);
      out[lVar5 * 2] = uVar4;
      uhugeint_t::uhugeint_t(&local_f8,0x20);
      local_e8 = uhugeint_t::operator>>(in,&local_f8);
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      out[lVar5 * 2 + 1] = uVar4;
      lVar5 = lVar5 + 1;
      in = in + 1;
    } while (lVar5 != 0x20);
    break;
  case 3:
    lVar5 = 8;
    do {
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(in);
      *(uint32_t *)((long)out + lVar5 + -8) = uVar4;
      uhugeint_t::uhugeint_t(&local_f8,0x20);
      local_e8 = uhugeint_t::operator>>(in,&local_f8);
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar5 + -4) = uVar4;
      uhugeint_t::uhugeint_t(&local_f8,0x40);
      local_e8 = uhugeint_t::operator>>(in,&local_f8);
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar5) = uVar4;
      lVar5 = lVar5 + 0xc;
      in = in + 1;
    } while (lVar5 != 0x188);
    break;
  case 4:
    lVar5 = 0;
    do {
      puVar10 = (uhugeint_t *)((long)&in->lower + lVar5);
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(puVar10);
      *(uint32_t *)((long)out + lVar5) = uVar4;
      uhugeint_t::uhugeint_t(&local_f8,0x20);
      local_e8 = uhugeint_t::operator>>(puVar10,&local_f8);
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar5 + 4) = uVar4;
      uhugeint_t::uhugeint_t(&local_f8,0x40);
      local_e8 = uhugeint_t::operator>>(puVar10,&local_f8);
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar5 + 8) = uVar4;
      uhugeint_t::uhugeint_t(&local_f8,0x60);
      local_e8 = uhugeint_t::operator>>(puVar10,&local_f8);
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar5 + 0xc) = uVar4;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x200);
    break;
  default:
    local_c8 = (uint64_t)width;
    uVar11 = 0;
    lVar5 = 0;
    do {
      value = local_c8;
      puVar1 = (uint64_t *)((long)&in->lower + lVar5);
      local_78 = *puVar1;
      uStack_70 = puVar1[1];
      local_c0 = lVar5;
      local_a8 = out;
      uhugeint_t::uhugeint_t(&local_40,1);
      uhugeint_t::uhugeint_t(&local_50,value);
      local_88 = uhugeint_t::operator<<(&local_40,&local_50);
      uhugeint_t::uhugeint_t(&local_60,1);
      local_b8 = uhugeint_t::operator-(&local_88,&local_60);
      puVar3 = local_a8;
      local_e8.upper = uStack_70;
      local_e8.lower = local_78;
      uVar9 = (uint)uVar11;
      uVar8 = uVar9 & 0x1f;
      uVar7 = (int)local_90 + uVar8;
      if (uVar7 < 0x20) {
        if ((uVar11 & 0x1f) == 0) {
          local_f8 = uhugeint_t::operator&(&local_e8,&local_b8);
          uVar7 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          out = local_a8;
LAB_016f5c83:
          *out = uVar7;
        }
        else {
          local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(uVar9 & 0x1f));
          local_f8 = uhugeint_t::operator<<(&local_d8,&local_a0);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *local_a8 = *local_a8 | uVar4;
          out = local_a8;
        }
      }
      else if (uVar7 < 0x40) {
        if ((uVar11 & 0x1f) == 0) {
          local_f8 = uhugeint_t::operator&(&local_e8,&local_b8);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *local_a8 = uVar4;
        }
        else {
          local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(uVar9 & 0x1f));
          local_f8 = uhugeint_t::operator<<(&local_d8,&local_a0);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *local_a8 = *local_a8 | uVar4;
        }
        out = local_a8 + 1;
        if (uVar7 != 0x20) {
          local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x20 - uVar8));
          local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
          uVar7 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          goto LAB_016f5c83;
        }
      }
      else if (uVar7 < 0x60) {
        if ((uVar11 & 0x1f) == 0) {
          local_f8 = uhugeint_t::operator&(&local_e8,&local_b8);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *puVar3 = uVar4;
        }
        else {
          uhugeint_t::uhugeint_t(&local_d8,(ulong)(uVar9 & 0x1f));
          local_f8 = uhugeint_t::operator<<(&local_e8,&local_d8);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *puVar3 = *puVar3 | uVar4;
        }
        local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
        uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x20 - uVar8));
        local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
        uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
        puVar3[1] = uVar4;
        out = puVar3 + 2;
        if (uVar7 != 0x40) {
          local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x40 - uVar8));
          local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *out = uVar4;
        }
      }
      else if (uVar7 < 0x80) {
        if ((uVar11 & 0x1f) == 0) {
          local_f8 = uhugeint_t::operator&(&local_e8,&local_b8);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *puVar3 = uVar4;
        }
        else {
          uhugeint_t::uhugeint_t(&local_d8,(ulong)(uVar9 & 0x1f));
          local_f8 = uhugeint_t::operator<<(&local_e8,&local_d8);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *puVar3 = *puVar3 | uVar4;
        }
        local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
        uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x20 - uVar8));
        local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
        uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
        puVar3[1] = uVar4;
        local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
        uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x40 - uVar8));
        local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
        uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
        puVar3[2] = uVar4;
        out = puVar3 + 3;
        if (uVar7 != 0x60) {
          local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
          iVar6 = 0x60;
LAB_016f5fb9:
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(iVar6 - uVar8));
          local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
          *out = uVar4;
        }
      }
      else {
        uhugeint_t::uhugeint_t(&local_d8,(ulong)(uVar9 & 0x1f));
        local_f8 = uhugeint_t::operator<<(&local_e8,&local_d8);
        uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
        *puVar3 = *puVar3 | uVar4;
        local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
        uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x20 - uVar8));
        local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
        uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
        puVar3[1] = uVar4;
        local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
        uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x40 - uVar8));
        local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
        uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
        puVar3[2] = uVar4;
        local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
        uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x60 - uVar8));
        local_f8 = uhugeint_t::operator>>(&local_d8,&local_a0);
        uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_f8);
        puVar3[3] = uVar4;
        out = puVar3 + 4;
        if (uVar7 != 0x80) {
          local_d8 = uhugeint_t::operator&(&local_e8,&local_b8);
          iVar6 = 0x80;
          goto LAB_016f5fb9;
        }
      }
      lVar5 = local_c0 + 0x10;
      uVar11 = uVar11 + local_c8;
    } while (lVar5 != 0x1f0);
    bVar2 = (byte)local_90;
    puVar10 = in + 0x1f;
    uhugeint_t::uhugeint_t(&local_f8,(ulong)(-bVar2 & 0x1f));
    local_e8 = uhugeint_t::operator<<(puVar10,&local_f8);
    uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
    *out = *out | uVar4;
    if (0x20 < bVar2) {
      uVar7 = (uint)(-bVar2 & 0x1f);
      uhugeint_t::uhugeint_t(&local_f8,(ulong)(0x20 - uVar7));
      local_e8 = uhugeint_t::operator>>(puVar10,&local_f8);
      uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      out[1] = uVar4;
      if (0x40 < bVar2) {
        uhugeint_t::uhugeint_t(&local_f8,(ulong)(0x40 - uVar7));
        local_e8 = uhugeint_t::operator>>(puVar10,&local_f8);
        uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
        out[2] = uVar4;
        if (0x60 < bVar2) {
          uhugeint_t::uhugeint_t(&local_f8,(ulong)(0x60 - uVar7));
          local_e8 = uhugeint_t::operator>>(puVar10,&local_f8);
          uVar4 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
          out[3] = uVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void HugeIntPacker::Pack(const uhugeint_t *__restrict in, uint32_t *__restrict out, bitpacking_width_t width) {
	D_ASSERT(width <= 128);
	switch (width) {
	case 0:
		break;
	case 32:
		PackDelta32(in, out);
		break;
	case 64:
		PackDelta64(in, out);
		break;
	case 96:
		PackDelta96(in, out);
		break;
	case 128:
		PackDelta128(in, out);
		break;
	default:
		for (idx_t oindex = 0; oindex < BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - 1; ++oindex) {
			PackSingle(in[oindex], out, width, (width * oindex) % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE,
			           (uhugeint_t(1) << width) - 1);
		}
		PackLast(in, out, width);
	}
}